

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cryptoutil.cpp
# Opt level: O2

void __thiscall
CryptoUtil_DecryptAes256CbcToStringIvEmpty_Test::~CryptoUtil_DecryptAes256CbcToStringIvEmpty_Test
          (CryptoUtil_DecryptAes256CbcToStringIvEmpty_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CryptoUtil, DecryptAes256CbcToStringIvEmpty) {
  try {
    ByteData key(
        "616975656F616975656F616975656F616975656F616975656F616975656F6169");
    std::vector<uint8_t> iv;
    ByteData data(
        "2ef199bb7d160f94fc17fa5f01b220c630d6b19a5973f4b313868c921fc10d22");
    std::string result = CryptoUtil::DecryptAes256CbcToString(key.GetBytes(),
                                                              iv, data);
  } catch (const cfd::core::CfdException &cfd_except) {
    EXPECT_STREQ(cfd_except.what(), "DecryptAes256Cbc error.");
    return;
  }
  ASSERT_TRUE(false);
}